

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v4_8.c
# Opt level: O3

int can_fixup_bittiming_v4_8(net_device *dev,can_bittiming *bt,can_bittiming_const *btc)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = bt->sjw;
  if (uVar7 == 0) {
    bt->sjw = 1;
    uVar7 = 1;
  }
  iVar5 = -0x22;
  if ((((uVar7 <= btc->sjw_max) && (uVar7 = bt->phase_seg1 + bt->prop_seg, btc->tseg1_min <= uVar7))
      && (uVar7 <= btc->tseg1_max)) &&
     ((uVar1 = bt->phase_seg2, btc->tseg2_min <= uVar1 && (uVar1 <= btc->tseg2_max)))) {
    uVar3 = (ulong)bt->tq * (ulong)(dev->priv).clock.freq;
    uVar2 = btc->brp_inc;
    if (1 < (ulong)uVar2) {
      uVar3 = uVar3 / uVar2;
    }
    uVar6 = 1;
    if (1 < uVar2) {
      uVar6 = uVar2;
    }
    uVar6 = (int)((uVar3 + 499999999) / 1000000000) * uVar6;
    bt->brp = uVar6;
    iVar5 = -0x16;
    if ((btc->brp_min <= uVar6) && (uVar6 <= btc->brp_max)) {
      iVar4 = uVar7 + uVar1 + 1;
      iVar5 = 0;
      bt->bitrate = (dev->priv).clock.freq / (uVar6 * iVar4);
      bt->sample_point = (int)(uVar7 * 1000 + 1000) / iVar4;
    }
  }
  return iVar5;
}

Assistant:

static int can_fixup_bittiming(struct net_device *dev, struct can_bittiming *bt,
			       const struct can_bittiming_const *btc)
{
	struct can_priv *priv = netdev_priv(dev);
	int tseg1, alltseg;
	u64 brp64;

	tseg1 = bt->prop_seg + bt->phase_seg1;
	if (!bt->sjw)
		bt->sjw = 1;
	if (bt->sjw > btc->sjw_max ||
	    tseg1 < btc->tseg1_min || tseg1 > btc->tseg1_max ||
	    bt->phase_seg2 < btc->tseg2_min || bt->phase_seg2 > btc->tseg2_max)
		return -ERANGE;

	brp64 = (u64)priv->clock.freq * (u64)bt->tq;
	if (btc->brp_inc > 1)
		do_div(brp64, btc->brp_inc);
	brp64 += 500000000UL - 1;
	do_div(brp64, 1000000000UL); /* the practicable BRP */
	if (btc->brp_inc > 1)
		brp64 *= btc->brp_inc;
	bt->brp = (u32)brp64;

	if (bt->brp < btc->brp_min || bt->brp > btc->brp_max)
		return -EINVAL;

	alltseg = bt->prop_seg + bt->phase_seg1 + bt->phase_seg2 + 1;
	bt->bitrate = priv->clock.freq / (bt->brp * alltseg);
	bt->sample_point = ((tseg1 + 1) * 1000) / alltseg;

	return 0;
}